

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

RepeatedPtrFieldBase *
google::protobuf::Arena::Create<google::protobuf::internal::RepeatedPtrFieldBase>(Arena *arena)

{
  RepeatedPtrFieldBase *pRVar1;
  anon_class_8_1_a7a63227 local_20;
  anon_class_8_1_a7a63227 local_18;
  Arena *local_10;
  Arena *arena_local;
  
  local_20.arena = arena;
  local_18.arena = arena;
  local_10 = arena;
  pRVar1 = absl::lts_20240722::utility_internal::
           IfConstexprElse<true,google::protobuf::Arena::Create<google::protobuf::internal::RepeatedPtrFieldBase>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<google::protobuf::internal::RepeatedPtrFieldBase>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_2_>
                     (&local_18,&local_20);
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* Create(Arena* arena, Args&&... args) {
    return absl::utility_internal::IfConstexprElse<
        is_arena_constructable<T>::value>(
        // Arena-constructable
        [arena](auto&&... args) {
          using Type = std::remove_const_t<T>;
#ifdef __cpp_if_constexpr
          // DefaultConstruct/CopyConstruct are optimized for messages, which
          // are both arena constructible and destructor skippable and they
          // assume much. Don't use these functions unless the invariants
          // hold.
          if constexpr (is_destructor_skippable<T>::value) {
            constexpr auto construct_type = GetConstructType<T, Args&&...>();
            // We delegate to DefaultConstruct/CopyConstruct where appropriate
            // because protobuf generated classes have external templates for
            // these functions for code size reasons. When `if constexpr` is not
            // available always use the fallback.
            if constexpr (construct_type == ConstructType::kDefault) {
              return static_cast<Type*>(DefaultConstruct<Type>(arena));
            } else if constexpr (construct_type == ConstructType::kCopy) {
              return static_cast<Type*>(CopyConstruct<Type>(arena, &args...));
            }
          }
#endif
          return CreateArenaCompatible<Type>(arena,
                                             std::forward<Args>(args)...);
        },
        // Non arena-constructable
        [arena](auto&&... args) {
          if (PROTOBUF_PREDICT_FALSE(arena == nullptr)) {
            return new T(std::forward<Args>(args)...);
          }
          return new (arena->AllocateInternal<T>())
              T(std::forward<Args>(args)...);
        },
        std::forward<Args>(args)...);
  }